

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  int *piVar1;
  Bitmask BVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  int local_2c;
  int i;
  SrcList *pSrc;
  Bitmask mask;
  Select *pS_local;
  WhereMaskSet *pMaskSet_local;
  
  pSrc = (SrcList *)0x0;
  for (mask = (Bitmask)pS; mask != 0; mask = *(Bitmask *)(mask + 0x50)) {
    piVar1 = *(int **)(mask + 0x28);
    BVar2 = sqlite3WhereExprListUsage(pMaskSet,*(ExprList **)mask);
    BVar3 = sqlite3WhereExprListUsage(pMaskSet,*(ExprList **)(mask + 0x38));
    BVar4 = sqlite3WhereExprListUsage(pMaskSet,*(ExprList **)(mask + 0x48));
    BVar5 = sqlite3WhereExprUsage(pMaskSet,*(Expr **)(mask + 0x30));
    BVar6 = sqlite3WhereExprUsage(pMaskSet,*(Expr **)(mask + 0x40));
    pSrc = (SrcList *)(BVar6 | BVar5 | BVar4 | BVar3 | BVar2 | (ulong)pSrc);
    if (piVar1 != (int *)0x0) {
      for (local_2c = 0; local_2c < *piVar1; local_2c = local_2c + 1) {
        BVar2 = exprSelectUsage(pMaskSet,*(Select **)(piVar1 + (long)local_2c * 0x1c + 0xc));
        BVar3 = sqlite3WhereExprUsage(pMaskSet,*(Expr **)(piVar1 + (long)local_2c * 0x1c + 0x14));
        pSrc = (SrcList *)(BVar3 | BVar2 | (ulong)pSrc);
        if ((*(byte *)((long)piVar1 + (long)local_2c * 0x70 + 0x45) >> 2 & 1) != 0) {
          BVar2 = sqlite3WhereExprListUsage
                            (pMaskSet,*(ExprList **)(piVar1 + (long)local_2c * 0x1c + 0x1a));
          pSrc = (SrcList *)(BVar2 | (ulong)pSrc);
        }
      }
    }
  }
  return (Bitmask)pSrc;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].pOn);
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}